

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O1

longlong anon_unknown.dwarf_255680::StrToLong(char *p)

{
  char cVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  
  do {
    pcVar5 = p;
    cVar1 = *pcVar5;
    if (cVar1 == '\0') break;
    p = pcVar5 + 1;
  } while (cVar1 < '!');
  uVar2 = (int)pcVar5[cVar1 == '-'] - 0x30;
  if (uVar2 < 10) {
    pcVar5 = pcVar5 + 1 + (cVar1 == '-');
    lVar4 = 0;
    do {
      lVar4 = (ulong)uVar2 + lVar4 * 10;
      uVar2 = (int)*pcVar5 - 0x30;
      pcVar5 = pcVar5 + 1;
    } while (uVar2 < 10);
  }
  else {
    lVar4 = 0;
  }
  lVar3 = -lVar4;
  if (cVar1 != '-') {
    lVar3 = lVar4;
  }
  return lVar3;
}

Assistant:

long long StrToLong(const char* p)
	{
		while(*p && *p <= ' ')
			p++;

		bool negative = *p == '-';
		if(negative)
			p++;

		unsigned long long res = 0;
		while(unsigned(*p - '0') < 10)
			res = res * 10 + unsigned(*p++ - '0');

		return res * (negative ? -1 : 1);
	}